

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

bool __thiscall
acto::core::anon_unknown_0::binding_context_t::process_actors
          (binding_context_t *this,bool need_delete)

{
  _Hash_node_base _Var1;
  __node_base *p_Var2;
  undefined8 uVar3;
  pointer *__ptr;
  undefined7 in_register_00000031;
  bool bVar4;
  object_t *local_58;
  undefined4 local_4c;
  node<acto::core::object_t> local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000031,need_delete);
  runtime_t::instance();
  local_40 = &this->actors;
  p_Var2 = &(this->actors)._M_h._M_before_begin;
  bVar4 = false;
  local_38 = p_Var2;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    while (object_t::select_message((object_t *)&stack0xffffffffffffffb8),
          local_48.next != (object_t *)0x0) {
      local_58 = local_48.next;
      local_48.next = (object_t *)0x0;
      (*runtime_t::instance::value.super_callbacks._vptr_callbacks[2])
                (&runtime_t::instance::value,p_Var2[1]._M_nxt,&local_58);
      if (local_58 != (object_t *)0x0) {
        (*(code *)(((local_58->super_node<acto::core::object_t>).next)->cs).super___mutex_base.
                  _M_mutex.__align)();
      }
      local_58 = (object_t *)0x0;
      if (local_48.next != (object_t *)0x0) {
        (*(code *)((((local_48.next)->super_node<acto::core::object_t>).next)->cs).
                  super___mutex_base._M_mutex.__align)();
      }
      bVar4 = true;
    }
    _Var1._M_nxt = p_Var2[1]._M_nxt;
    std::mutex::lock((mutex *)&((pthread_mutex_t *)(_Var1._M_nxt + 1))->__data);
    *(byte *)&p_Var2[1]._M_nxt[0xc]._M_nxt = *(byte *)&p_Var2[1]._M_nxt[0xc]._M_nxt & 0xf7;
    pthread_mutex_unlock((pthread_mutex_t *)(_Var1._M_nxt + 1));
    if ((char)local_4c != '\0') {
      runtime_t::deconstruct_object(&runtime_t::instance::value,(object_t *)p_Var2[1]._M_nxt);
    }
  }
  uVar3 = local_38;
  if ((char)local_4c != '\0') {
    while (uVar3 = ((__node_base *)uVar3)->_M_nxt, (__node_base *)uVar3 != (__node_base *)0x0) {
      runtime_t::release(&runtime_t::instance::value,(object_t *)*(_Hash_node_base **)(uVar3 + 8));
    }
    std::
    _Hashtable<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear((_Hashtable<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)local_40);
  }
  return bVar4;
}

Assistant:

bool process_actors(const bool need_delete) {
    auto runtime = runtime_t::instance();
    bool something_was_processed = false;
    // TODO: - switch between active actors to balance message processing.
    //       - detect message loop.
    for (auto ai = actors.cbegin(); ai != actors.cend(); ++ai) {
      while (auto msg = (*ai)->select_message()) {
        runtime->handle_message(*ai, std::move(msg));
        something_was_processed = true;
      }
      {
        std::lock_guard<std::mutex> g((*ai)->cs);
        (*ai)->scheduled = false;
      }
      if (need_delete) {
        runtime->deconstruct_object(*ai);
      }
    }

    if (need_delete) {
      for (auto ai = actors.cbegin(); ai != actors.cend(); ++ai) {
        runtime->release(*ai);
      }

      actors.clear();
    }

    return something_was_processed;
  }